

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderProgramResource.cpp
# Opt level: O0

bool __thiscall
glcts::GeometryShaderProgramResourceTest::checkIfResourceAtIndexIsReferenced
          (GeometryShaderProgramResourceTest *this,GLuint program_object_id,GLenum interface,
          GLuint index)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  GLenum local_38;
  int local_34;
  GLenum props [1];
  GLint params [1];
  Functions *gl;
  GLuint index_local;
  GLenum interface_local;
  GLuint program_object_id_local;
  GeometryShaderProgramResourceTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _props = CONCAT44(extraout_var,iVar1);
  memset(&local_34,0,4);
  local_38 = (this->super_TestCaseBase).m_glExtTokens.REFERENCED_BY_GEOMETRY_SHADER;
  (**(code **)(_props + 0x9c8))(this->m_program_object_id,interface,index,1,&local_38,1,0,&local_34)
  ;
  return local_34 == 1;
}

Assistant:

bool GeometryShaderProgramResourceTest::checkIfResourceAtIndexIsReferenced(glw::GLuint program_object_id,
																		   glw::GLenum interface,
																		   glw::GLuint index) const
{
	(void)program_object_id;

	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Data for getProgramResourceiv */
	glw::GLint  params[] = { 0 };
	glw::GLenum props[]  = { m_glExtTokens.REFERENCED_BY_GEOMETRY_SHADER };

	/* Get property value */
	gl.getProgramResourceiv(m_program_object_id, interface, index, 1, /* propCount */
							props, 1,								  /* bufSize */
							0,										  /* length */
							params);

	/**
	 *     The value one is written to <params> if an active
	 *     variable is referenced by the corresponding shader, or if an active
	 *     uniform block, shader storage block, or atomic counter buffer contains
	 *     at least one variable referenced by the corresponding shader.  Otherwise,
	 *     the value zero is written to <params>.
	 **/
	if (1 == params[0])
	{
		return true;
	}
	else
	{
		return false;
	}
}